

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llog.cpp
# Opt level: O2

bool __thiscall ins::Configuration::Configure(Configuration *this,int type,string *val)

{
  bool bVar1;
  bool bVar2;
  LLog *this_00;
  
  if (type == 0) {
    bVar1 = std::operator==(val,"VERBOSE");
    if (bVar1) {
      this->log_level_ = VERBOSE;
    }
    bVar1 = std::operator==(val,"INFO");
    if (bVar1) {
      this->log_level_ = INFO;
    }
    bVar1 = std::operator==(val,"WARNING");
    if (bVar1) {
      this->log_level_ = WARNING;
    }
    bVar1 = std::operator==(val,"ERROR");
    bVar2 = true;
    if (bVar1) {
      this->log_level_ = ERROR;
    }
  }
  else {
    if (type == 1) {
      this_00 = LLog::Instance();
      bVar1 = LLog::DupLogToFile(this_00,val);
      return bVar1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Configuration::Configure(int type, const std::string &val) noexcept {
  switch (type) {
    case LOG_FILE:{
      return LLog::Instance().DupLogToFile(val);
    }
    case LOG_LEVEL:{
      if (val == "VERBOSE") log_level_ = VERBOSE;
      if (val == "INFO") log_level_ = INFO;
      if (val == "WARNING") log_level_ = WARNING;
      if (val == "ERROR") log_level_ = ERROR;
      return true;
    }
    default:
      return false;
  }
}